

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.h
# Opt level: O2

void __thiscall
ImVector<ImGuiTextFilter::ImGuiTextRange>::push_back
          (ImVector<ImGuiTextFilter::ImGuiTextRange> *this,ImGuiTextRange *v)

{
  ImGuiTextRange *pIVar1;
  char *pcVar2;
  int iVar3;
  int iVar4;
  int new_capacity;
  
  iVar4 = this->Size;
  if (iVar4 == this->Capacity) {
    if (iVar4 == 0) {
      iVar3 = 8;
    }
    else {
      iVar3 = iVar4 / 2 + iVar4;
    }
    new_capacity = iVar4 + 1;
    if (iVar4 + 1 < iVar3) {
      new_capacity = iVar3;
    }
    reserve(this,new_capacity);
    iVar4 = this->Size;
  }
  pIVar1 = this->Data;
  pcVar2 = v->e;
  pIVar1[iVar4].b = v->b;
  pIVar1[iVar4].e = pcVar2;
  this->Size = this->Size + 1;
  return;
}

Assistant:

inline void         push_back(const T& v)               { if (Size == Capacity) reserve(_grow_capacity(Size + 1)); memcpy(&Data[Size], &v, sizeof(v)); Size++; }